

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O1

wchar_t * noedit_wgets(EditLine *el,wchar_t *nread)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  int *piVar4;
  wchar_t *pwVar5;
  
  while( true ) {
    wVar2 = (*el->el_read->read_char)(el,(el->el_line).lastchar);
    if (wVar2 != L'\x01') break;
    if ((el->el_line).limit <= (el->el_line).lastchar + 1) {
      wVar3 = ch_enlargebufs(el,2);
      if (wVar3 == L'\0') break;
    }
    pwVar5 = (el->el_line).lastchar;
    (el->el_line).lastchar = pwVar5 + 1;
    if ((((el->el_flags & L'\b') != L'\0') || (wVar3 = *pwVar5, wVar3 == L'\r')) || (wVar3 == L'\n')
       ) break;
  }
  if (wVar2 == L'\xffffffff') {
    piVar4 = __errno_location();
    if (*piVar4 == 4) {
      (el->el_line).lastchar = (el->el_line).buffer;
    }
  }
  pwVar5 = (el->el_line).lastchar;
  (el->el_line).cursor = pwVar5;
  *pwVar5 = L'\0';
  pwVar1 = (el->el_line).buffer;
  wVar2 = (wchar_t)((ulong)((long)pwVar5 - (long)pwVar1) >> 2);
  *nread = wVar2;
  pwVar5 = (wchar_t *)0x0;
  if (wVar2 != L'\0') {
    pwVar5 = pwVar1;
  }
  return pwVar5;
}

Assistant:

static const wchar_t *
noedit_wgets(EditLine *el, int *nread)
{
	el_line_t	*lp = &el->el_line;
	int		 num;

	while ((num = (*el->el_read->read_char)(el, lp->lastchar)) == 1) {
		if (lp->lastchar + 1 >= lp->limit &&
		    !ch_enlargebufs(el, (size_t)2))
			break;
		lp->lastchar++;
		if (el->el_flags & UNBUFFERED ||
		    lp->lastchar[-1] == '\r' ||
		    lp->lastchar[-1] == '\n')
			break;
	}
	if (num == -1 && errno == EINTR)
		lp->lastchar = lp->buffer;
	lp->cursor = lp->lastchar;
	*lp->lastchar = '\0';
	*nread = (int)(lp->lastchar - lp->buffer);
	return *nread ? lp->buffer : NULL;
}